

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O1

void * setup_malloc(vorb *f,int sz)

{
  int iVar1;
  char *pcVar2;
  void *pvVar3;
  uint uVar4;
  int iVar5;
  
  uVar4 = sz + 7U & 0xfffffff8;
  f->setup_memory_required = f->setup_memory_required + uVar4;
  pcVar2 = (f->alloc).alloc_buffer;
  if (pcVar2 == (char *)0x0) {
    if (uVar4 != 0) {
      pvVar3 = malloc((long)(int)uVar4);
      return pvVar3;
    }
  }
  else {
    iVar1 = f->setup_offset;
    iVar5 = uVar4 + iVar1;
    if (iVar5 <= f->temp_offset) {
      f->setup_offset = iVar5;
      return pcVar2 + iVar1;
    }
  }
  return (void *)0x0;
}

Assistant:

static void *setup_malloc(vorb *f, int sz)
{
   sz = (sz+7) & ~7; // round up to nearest 8 for alignment of future allocs.
   f->setup_memory_required += sz;
   if (f->alloc.alloc_buffer) {
      void *p = (char *) f->alloc.alloc_buffer + f->setup_offset;
      if (f->setup_offset + sz > f->temp_offset) return NULL;
      f->setup_offset += sz;
      return p;
   }
   return sz ? malloc(sz) : NULL;
}